

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *s,QUuid *id)

{
  ByteOrder BVar1;
  long lVar2;
  qint64 qVar3;
  undefined1 *extraout_RDX;
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  int i;
  char *data;
  int NumBytes;
  Id128Bytes id128;
  char bytes [16];
  void *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb4;
  unsigned_short src;
  int iVar4;
  uchar *in_stack_ffffffffffffffb8;
  Id128Bytes **ppIVar5;
  undefined4 in_stack_ffffffffffffffc0;
  Endian order;
  Id128Bytes *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  order = 0x10;
  local_18 = (Id128Bytes *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  BVar1 = QDataStream::byteOrder(in_RDI);
  if (BVar1 == BigEndian) {
    local_18 = QUuid::toBytes((QUuid *)in_RSI,order);
    local_10 = extraout_RDX;
  }
  else {
    ppIVar5 = &local_18;
    qToLittleEndian<unsigned_int>(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    lVar2 = (long)ppIVar5 + 4;
    src = (unsigned_short)(in_stack_ffffffffffffffb4 >> 0x10);
    qToLittleEndian<unsigned_short>(src,in_stack_ffffffffffffffa8);
    lVar2 = lVar2 + 2;
    qToLittleEndian<unsigned_short>(src,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb8 = (uchar *)(lVar2 + 2);
    for (iVar4 = 0; iVar4 < 8; iVar4 = iVar4 + 1) {
      *in_stack_ffffffffffffffb8 = *(uchar *)((long)&in_RSI->dev + (long)iVar4);
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1;
    }
  }
  qVar3 = QDataStream::writeRawData
                    (in_RSI,(char *)CONCAT44(order,in_stack_ffffffffffffffc0),
                     (qint64)in_stack_ffffffffffffffb8);
  if (qVar3 != 0x10) {
    QDataStream::setStatus(in_RDI,WriteFailed);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QUuid &id)
{
    constexpr int NumBytes = sizeof(QUuid);
    static_assert(NumBytes == 16, "Change the serialization format when this ever hits");
    char bytes[NumBytes];
    if (s.byteOrder() == QDataStream::BigEndian) {
        const auto id128 = id.toBytes();
        static_assert(sizeof(id128) == NumBytes);
        memcpy(bytes, &id128, NumBytes);
    } else {
        auto *data = bytes;

        // for historical reasons, our little-endian serialization format
        // stores each of the UUID fields in little endian, instead of storing
        // a little endian Id128
        qToLittleEndian(id.data1, data);
        data += sizeof(quint32);
        qToLittleEndian(id.data2, data);
        data += sizeof(quint16);
        qToLittleEndian(id.data3, data);
        data += sizeof(quint16);

        for (int i = 0; i < 8; ++i) {
            *(data) = id.data4[i];
            data++;
        }
    }

    if (s.writeRawData(bytes, NumBytes) != NumBytes)
        s.setStatus(QDataStream::WriteFailed);

    return s;
}